

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O1

aom_codec_err_t ctrl_set_byte_alignment(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  aom_codec_err_t aVar2;
  uint *puVar3;
  uint uVar4;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar3 = (uint *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar3 = (uint *)args->overflow_arg_area;
    args->overflow_arg_area = puVar3 + 2;
  }
  uVar1 = *puVar3;
  if ((uVar1 == 0) ||
     ((aVar2 = AOM_CODEC_INVALID_PARAM, uVar1 - 0x20 < 0x3e1 &&
      (uVar4 = uVar1 - (uVar1 >> 1 & 0x55555555),
      uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333),
      ((uVar4 >> 4) + uVar4 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)))) {
    ctx->byte_alignment = uVar1;
    aVar2 = AOM_CODEC_OK;
    if (ctx->frame_worker != (AVxWorker *)0x0) {
      *(uint *)(*ctx->frame_worker->data1 + 0x3d60) = uVar1;
    }
  }
  return aVar2;
}

Assistant:

static aom_codec_err_t ctrl_set_byte_alignment(aom_codec_alg_priv_t *ctx,
                                               va_list args) {
  const int legacy_byte_alignment = 0;
  const int min_byte_alignment = 32;
  const int max_byte_alignment = 1024;
  const int byte_alignment = va_arg(args, int);

  if (byte_alignment != legacy_byte_alignment &&
      (byte_alignment < min_byte_alignment ||
       byte_alignment > max_byte_alignment ||
       (byte_alignment & (byte_alignment - 1)) != 0))
    return AOM_CODEC_INVALID_PARAM;

  ctx->byte_alignment = byte_alignment;
  if (ctx->frame_worker) {
    AVxWorker *const worker = ctx->frame_worker;
    FrameWorkerData *const frame_worker_data = (FrameWorkerData *)worker->data1;
    frame_worker_data->pbi->common.features.byte_alignment = byte_alignment;
  }
  return AOM_CODEC_OK;
}